

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_allocation.c
# Opt level: O1

void PaUtil_FreeAllAllocations(PaUtilAllocationGroup *group)

{
  PaUtilAllocationGroupLink *pPVar1;
  PaUtilAllocationGroupLink *pPVar2;
  
  pPVar1 = group->allocations;
  if (group->allocations == (PaUtilAllocationGroupLink *)0x0) {
    pPVar2 = (PaUtilAllocationGroupLink *)0x0;
  }
  else {
    do {
      pPVar2 = pPVar1;
      PaUtil_FreeMemory(pPVar2->buffer);
      pPVar2->buffer = (void *)0x0;
      pPVar1 = pPVar2->next;
    } while (pPVar2->next != (PaUtilAllocationGroupLink *)0x0);
  }
  if (pPVar2 != (PaUtilAllocationGroupLink *)0x0) {
    pPVar2->next = group->spareLinks;
    group->spareLinks = group->allocations;
    group->allocations = (PaUtilAllocationGroupLink *)0x0;
  }
  return;
}

Assistant:

void PaUtil_FreeAllAllocations( PaUtilAllocationGroup* group )
{
    struct PaUtilAllocationGroupLink *current = group->allocations;
    struct PaUtilAllocationGroupLink *previous = 0;

    /* free all buffers in the allocations list */
    while( current )
    {
        PaUtil_FreeMemory( current->buffer );
        current->buffer = 0;

        previous = current;
        current = current->next;
    }

    /* link the former allocations list onto the front of the spareLinks list */
    if( previous )
    {
        previous->next = group->spareLinks;
        group->spareLinks = group->allocations;
        group->allocations = 0;
    }
}